

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenComparatorForStruct
          (CppGenerator *this,StructDef *struct_def,size_t space_size,string *lhs_struct_literal,
          string *rhs_struct_literal)

{
  CodeWriter *this_00;
  BaseType BVar1;
  FieldDef *pFVar2;
  StructDef *pSVar3;
  pointer ppFVar4;
  string *text;
  char cVar5;
  allocator<char> local_3ea;
  allocator<char> local_3e9;
  string space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  size_t local_370;
  size_t local_368;
  string *local_360;
  pointer local_358;
  string curr_field_name;
  string local_330;
  string local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&space,"LHS_PREFIX",(allocator<char> *)&curr_field_name);
  this_00 = &this->code_;
  local_360 = lhs_struct_literal;
  CodeWriter::SetValue(this_00,&space,lhs_struct_literal);
  std::__cxx11::string::~string((string *)&space);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&space,"RHS_PREFIX",(allocator<char> *)&curr_field_name);
  CodeWriter::SetValue(this_00,&space,rhs_struct_literal);
  std::__cxx11::string::~string((string *)&space);
  space._M_dataplus._M_p = (pointer)&space.field_2;
  std::__cxx11::string::_M_construct((ulong)&space,(char)space_size);
  ppFVar4 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_358 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_370 = space_size + 2;
  local_368 = space_size;
  do {
    if (ppFVar4 == local_358) {
      std::__cxx11::string::~string((string *)&space);
      return;
    }
    Name_abi_cxx11_(&curr_field_name,this,*ppFVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"CURR_FIELD_NAME",(allocator<char> *)&local_3b0);
    CodeWriter::SetValue(this_00,&local_310,&curr_field_name);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"LHS",(allocator<char> *)&local_330);
    std::operator+(&local_390,local_360,"_");
    std::operator+(&local_3b0,&local_390,&curr_field_name);
    CodeWriter::SetValue(this_00,&local_310,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"RHS",(allocator<char> *)&local_330);
    std::operator+(&local_390,rhs_struct_literal,"_");
    std::operator+(&local_3b0,&local_390,&curr_field_name);
    CodeWriter::SetValue(this_00,&local_310,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_310);
    pFVar2 = *ppFVar4;
    BVar1 = (pFVar2->value).type.base_type;
    if (BVar1 == BASE_TYPE_STRUCT) {
      cVar5 = ((pFVar2->value).type.struct_def)->fixed;
    }
    else {
      cVar5 = '\0';
    }
    if (pFVar2->key == true) {
      std::operator+(&local_90,&space,"const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();");
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::operator+(&local_b0,&space,
                     "const auto {{CURR_FIELD_NAME}}_compare_result = {{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});"
                    );
      CodeWriter::operator+=(this_00,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::operator+(&local_d0,&space,"if ({{CURR_FIELD_NAME}}_compare_result != 0)");
      CodeWriter::operator+=(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::operator+(&local_f0,&space,"  return {{CURR_FIELD_NAME}}_compare_result;");
      text = &local_f0;
      CodeWriter::operator+=(this_00,text);
LAB_00164797:
      std::__cxx11::string::~string((string *)text);
    }
    else {
      std::operator+(&local_110,&space,"const auto {{LHS}} = {{LHS_PREFIX}}.{{CURR_FIELD_NAME}}();")
      ;
      CodeWriter::operator+=(this_00,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::operator+(&local_130,&space,"const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();")
      ;
      CodeWriter::operator+=(this_00,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
        std::operator+(&local_150,&space,"if ({{LHS}} != {{RHS}})");
        CodeWriter::operator+=(this_00,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::operator+(&local_170,&space,
                       "  return static_cast<int>({{LHS}} > {{RHS}}) - static_cast<int>({{LHS}} < {{RHS}});"
                      );
        text = &local_170;
        CodeWriter::operator+=(this_00,text);
        goto LAB_00164797;
      }
      if (BVar1 == BASE_TYPE_ARRAY) {
        BVar1 = ((*ppFVar4)->value).type.element;
        pSVar3 = ((*ppFVar4)->value).type.struct_def;
        std::operator+(&local_190,&space,
                       "for (::flatbuffers::uoffset_t i = 0; i < {{LHS}}->size(); i++) {");
        CodeWriter::operator+=(this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::operator+(&local_1b0,&space,"  const auto {{LHS}}_elem = {{LHS}}->Get(i);");
        CodeWriter::operator+=(this_00,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::operator+(&local_1d0,&space,"  const auto {{RHS}}_elem = {{RHS}}->Get(i);");
        CodeWriter::operator+=(this_00,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
          std::operator+(&local_1f0,&space,"  if ({{LHS}}_elem != {{RHS}}_elem)");
          CodeWriter::operator+=(this_00,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::operator+(&local_210,&space,
                         "    return static_cast<int>({{LHS}}_elem > {{RHS}}_elem) - static_cast<int>({{LHS}}_elem < {{RHS}}_elem);"
                        );
          CodeWriter::operator+=(this_00,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::operator+(&local_230,&space,"}");
          text = &local_230;
          CodeWriter::operator+=(this_00,text);
        }
        else {
          if ((BVar1 != BASE_TYPE_STRUCT) || (pSVar3->fixed != true)) goto LAB_0016479c;
          if ((*ppFVar4)->key == true) {
            std::operator+(&local_250,&space,
                           "const auto {{CURR_FIELD_NAME}}_compare_result = {{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});"
                          );
            CodeWriter::operator+=(this_00,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::operator+(&local_270,&space,"if ({{CURR_FIELD_NAME}}_compare_result != 0)");
            CodeWriter::operator+=(this_00,&local_270);
            std::__cxx11::string::~string((string *)&local_270);
            std::operator+(&local_290,&space,"  return {{CURR_FIELD_NAME}}_compare_result;");
            text = &local_290;
            CodeWriter::operator+=(this_00,text);
          }
          else {
            pSVar3 = ((*ppFVar4)->value).type.struct_def;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b0,"LHS",&local_3e9);
            CodeWriter::GetValue(&local_310,this_00,&local_3b0);
            std::operator+(&local_2b0,&local_310,"_elem");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_330,"RHS",&local_3ea);
            CodeWriter::GetValue(&local_390,this_00,&local_330);
            std::operator+(&local_50,&local_390,"_elem");
            GenComparatorForStruct(this,pSVar3,local_370,&local_2b0,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_390);
            std::__cxx11::string::~string((string *)&local_330);
            std::__cxx11::string::~string((string *)&local_2b0);
            std::__cxx11::string::~string((string *)&local_310);
            std::__cxx11::string::~string((string *)&local_3b0);
            std::operator+(&local_2d0,&space,"}");
            text = &local_2d0;
            CodeWriter::operator+=(this_00,text);
          }
        }
        goto LAB_00164797;
      }
      if (cVar5 != '\0') {
        pSVar3 = ((*ppFVar4)->value).type.struct_def;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,"LHS",(allocator<char> *)&local_390);
        CodeWriter::GetValue(&local_2f0,this_00,&local_310);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b0,"RHS",(allocator<char> *)&local_330);
        CodeWriter::GetValue(&local_70,this_00,&local_3b0);
        GenComparatorForStruct(this,pSVar3,local_368,&local_2f0,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_2f0);
        text = &local_310;
        goto LAB_00164797;
      }
    }
LAB_0016479c:
    std::__cxx11::string::~string((string *)&curr_field_name);
    ppFVar4 = ppFVar4 + 1;
  } while( true );
}

Assistant:

void GenComparatorForStruct(const StructDef &struct_def, size_t space_size,
                              const std::string lhs_struct_literal,
                              const std::string rhs_struct_literal) {
    code_.SetValue("LHS_PREFIX", lhs_struct_literal);
    code_.SetValue("RHS_PREFIX", rhs_struct_literal);
    std::string space(space_size, ' ');
    for (const auto &curr_field : struct_def.fields.vec) {
      const auto curr_field_name = Name(*curr_field);
      code_.SetValue("CURR_FIELD_NAME", curr_field_name);
      code_.SetValue("LHS", lhs_struct_literal + "_" + curr_field_name);
      code_.SetValue("RHS", rhs_struct_literal + "_" + curr_field_name);
      const bool is_scalar = IsScalar(curr_field->value.type.base_type);
      const bool is_array = IsArray(curr_field->value.type);
      const bool is_struct = IsStruct(curr_field->value.type);

      // If encouter a key field, call KeyCompareWithValue to compare this
      // field.
      if (curr_field->key) {
        code_ += space +
                 "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
        code_ += space +
                 "const auto {{CURR_FIELD_NAME}}_compare_result = "
                 "{{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});";

        code_ += space + "if ({{CURR_FIELD_NAME}}_compare_result != 0)";
        code_ += space + "  return {{CURR_FIELD_NAME}}_compare_result;";
        continue;
      }

      code_ +=
          space + "const auto {{LHS}} = {{LHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
      code_ +=
          space + "const auto {{RHS}} = {{RHS_PREFIX}}.{{CURR_FIELD_NAME}}();";
      if (is_scalar) {
        code_ += space + "if ({{LHS}} != {{RHS}})";
        code_ += space +
                 "  return static_cast<int>({{LHS}} > {{RHS}}) - "
                 "static_cast<int>({{LHS}} < {{RHS}});";
      } else if (is_array) {
        const auto &elem_type = curr_field->value.type.VectorType();
        code_ +=
            space +
            "for (::flatbuffers::uoffset_t i = 0; i < {{LHS}}->size(); i++) {";
        code_ += space + "  const auto {{LHS}}_elem = {{LHS}}->Get(i);";
        code_ += space + "  const auto {{RHS}}_elem = {{RHS}}->Get(i);";
        if (IsScalar(elem_type.base_type)) {
          code_ += space + "  if ({{LHS}}_elem != {{RHS}}_elem)";
          code_ += space +
                   "    return static_cast<int>({{LHS}}_elem > {{RHS}}_elem) - "
                   "static_cast<int>({{LHS}}_elem < {{RHS}}_elem);";
          code_ += space + "}";

        } else if (IsStruct(elem_type)) {
          if (curr_field->key) {
            code_ += space +
                     "const auto {{CURR_FIELD_NAME}}_compare_result = "
                     "{{LHS_PREFIX}}.KeyCompareWithValue({{RHS}});";
            code_ += space + "if ({{CURR_FIELD_NAME}}_compare_result != 0)";
            code_ += space + "  return {{CURR_FIELD_NAME}}_compare_result;";
            continue;
          }
          GenComparatorForStruct(
              *curr_field->value.type.struct_def, space_size + 2,
              code_.GetValue("LHS") + "_elem", code_.GetValue("RHS") + "_elem");

          code_ += space + "}";
        }

      } else if (is_struct) {
        GenComparatorForStruct(*curr_field->value.type.struct_def, space_size,
                               code_.GetValue("LHS"), code_.GetValue("RHS"));
      }
    }
  }